

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.hpp
# Opt level: O3

double __thiscall
openjij::graph::Polynomial<double>::J<int,int>(Polynomial<double> *this,int args,int args_1)

{
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> copied_key;
  allocator_type local_41;
  double local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  unsigned_long local_20;
  long local_18;
  
  local_20 = (unsigned_long)args;
  local_18 = (long)args_1;
  __l._M_len = 2;
  __l._M_array = &local_20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__l,&local_41);
  local_40 = J(this,&local_38);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_40;
}

Assistant:

FloatType J(Args... args) const {
    std::vector<Index> copied_key{(Index)args...};
    return J(copied_key);
  }